

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * MyGame_Example_Alt_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  ulong uVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  char *pcVar4;
  uint64_t uVar5;
  float *struct_base;
  char *pcVar6;
  int *piVar7;
  char *buf_00;
  ulong *puVar8;
  void *struct_base_00;
  undefined1 *type_parsers;
  flatcc_builder_ref_t *pfVar9;
  size_t sVar10;
  flatcc_builder_t *pfVar11;
  flatbuffers_voffset_t fVar12;
  size_t __n;
  long lVar13;
  float *pfVar14;
  bool bVar15;
  int id;
  int8_t val;
  int more_1;
  flatcc_builder_ref_t ref;
  int more;
  flatcc_builder_ref_t ref_1;
  float *local_70;
  int local_64;
  size_t h_unions;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  flatcc_builder_ref_t *local_38;
  
  *result = 0;
  iVar2 = flatcc_builder_start_table(ctx->ctx,9);
  if ((iVar2 != 0) ||
     (pcVar4 = flatcc_json_parser_prepare_unions(ctx,buf,end,1,&h_unions), pcVar4 == end))
  goto LAB_0010a3d4;
  local_38 = result;
  buf = flatcc_json_parser_object_start(ctx,buf,end,&more);
LAB_0010a43f:
  if (more == 0) goto LAB_0010c5bc;
  pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
  uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
  buf = pcVar4;
  if (uVar5 < 0x6d756c74696b0000) {
    if (0x6d616e79616e78ff < uVar5) {
      if (uVar5 != 0x6d616e79616e795f) {
        pcVar6 = pcVar4;
        if (((uVar5 & 0x7fffffffffffff00) == 0x6d616e79616e7900) &&
           (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,7), pcVar4 != pcVar6)) {
          buf = flatcc_json_parser_union_vector
                          (ctx,pcVar6,end,0,3,h_unions,MyGame_Example_Any_parse_json_union);
          goto LAB_0010c57f;
        }
        buf = pcVar6;
        if (((uVar5 & 0x7fffffffff000000) != 0x6d6f766965000000) ||
           (buf = flatcc_json_parser_match_symbol(ctx,pcVar6,end,5), pcVar6 == buf))
        goto LAB_0010bec4;
        ref = 0;
        iVar2 = flatcc_builder_start_table(ctx->ctx,10);
        if ((iVar2 == 0) &&
           (pcVar4 = flatcc_json_parser_prepare_unions(ctx,buf,end,5,(size_t *)&more_1),
           pcVar4 != end)) {
          buf = flatcc_json_parser_object_start(ctx,buf,end,(int *)&val);
          while (_val != 0.0) {
            pcVar6 = flatcc_json_parser_symbol_start(ctx,buf,end);
            uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
            pcVar4 = pcVar6;
            if (uVar5 < 0x6368617261637465) {
              if (uVar5 == 0x63616d656f5f7479) {
                pcVar6 = pcVar6 + 8;
                uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                pcVar4 = pcVar6;
                if (((uVar5 & 0xffff000000000000) == 0x7065000000000000) &&
                   (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,2), pcVar6 != pcVar4)) {
                  sVar10 = 3;
                  fVar12 = 7;
                  type_parsers = Fantasy_Movie_parse_json_table_symbolic_parsers_49;
LAB_0010c31b:
                  pcVar4 = flatcc_json_parser_union_type
                                     (ctx,pcVar4,end,sVar10,fVar12,_more_1,
                                      (flatcc_json_parser_integral_symbol_f **)type_parsers,
                                      Fantasy_Character_parse_json_union);
                  goto LAB_0010c456;
                }
              }
              else if (uVar5 == 0x616e7461676f6e69) {
                pcVar6 = pcVar6 + 8;
                uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                if (uVar5 >> 8 == 0x73745f74797065) {
                  pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,7);
                  if (pcVar6 != pcVar4) {
                    sVar10 = 1;
                    fVar12 = 3;
                    type_parsers = Fantasy_Movie_parse_json_table_symbolic_parsers;
                    goto LAB_0010c31b;
                  }
                }
                else {
                  pcVar4 = pcVar6;
                  if (((uVar5 & 0xffff000000000000) == 0x7374000000000000) &&
                     (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,2), pcVar6 != pcVar4))
                  {
                    sVar10 = 1;
                    fVar12 = 3;
                    goto LAB_0010c42b;
                  }
                }
              }
              else if (((uVar5 & 0x7fffffffff000000) == 0x63616d656f000000) &&
                      (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,5), pcVar6 != pcVar4)
                      ) {
                sVar10 = 3;
                fVar12 = 7;
LAB_0010c42b:
                pcVar4 = flatcc_json_parser_union
                                   (ctx,pcVar4,end,sVar10,fVar12,_more_1,
                                    Fantasy_Character_parse_json_union);
                goto LAB_0010c456;
              }
LAB_0010c44e:
              pcVar4 = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
            }
            else {
              if (0x6d61696e5f636860 < uVar5) {
                if (uVar5 == 0x736964655f6b6963) {
                  pcVar6 = pcVar6 + 8;
                  uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                  if (uVar5 >> 0x10 == 0x6b5f74797065) {
                    pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,6);
                    if (pcVar6 != pcVar4) {
                      sVar10 = 2;
                      fVar12 = 5;
                      type_parsers = Fantasy_Movie_parse_json_table_symbolic_parsers_52;
                      goto LAB_0010c31b;
                    }
                  }
                  else {
                    pcVar4 = pcVar6;
                    if (((uVar5 & 0xff00000000000000) == 0x6b00000000000000) &&
                       (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,1), pcVar6 != pcVar4
                       )) {
                      sVar10 = 2;
                      fVar12 = 5;
                      goto LAB_0010c42b;
                    }
                  }
                }
                else if (uVar5 == 0x6d61696e5f636861) {
                  pcVar4 = pcVar6 + 8;
                  uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
                  if (uVar5 != 0x7261637465725f74) {
                    pcVar6 = pcVar4;
                    if (((uVar5 & 0xffffffffffff0000) == 0x7261637465720000) &&
                       (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,6), pcVar4 != pcVar6
                       )) {
                      pcVar4 = flatcc_json_parser_union
                                         (ctx,pcVar6,end,0,1,_more_1,
                                          Fantasy_Character_parse_json_union);
                    }
                    else {
                      pcVar4 = flatcc_json_parser_unmatched_symbol(ctx,pcVar6,end);
                    }
                    goto LAB_0010c456;
                  }
                  pcVar6 = pcVar6 + 0x10;
                  uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                  pcVar4 = pcVar6;
                  if (((uVar5 & 0xffffff0000000000) == 0x7970650000000000) &&
                     (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,3), pcVar6 != pcVar4))
                  {
                    sVar10 = 0;
                    fVar12 = 1;
                    type_parsers = Fantasy_Movie_parse_json_table_symbolic_parsers_51;
                    goto LAB_0010c31b;
                  }
                }
                goto LAB_0010c44e;
              }
              if (uVar5 != 0x6368617261637465) goto LAB_0010c44e;
              pcVar6 = pcVar6 + 8;
              uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
              if (uVar5 >> 8 == 0x72735f74797065) {
                pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,7);
                if (pcVar6 == pcVar4) goto LAB_0010c44e;
                pcVar4 = flatcc_json_parser_union_type_vector
                                   (ctx,pcVar4,end,4,9,_more_1,
                                    (flatcc_json_parser_integral_symbol_f **)
                                    Fantasy_Movie_parse_json_table_symbolic_parsers_50,
                                    Fantasy_Character_parse_json_union,
                                    Fantasy_Character_json_union_accept_type);
              }
              else {
                pcVar4 = pcVar6;
                if (((uVar5 & 0xffff000000000000) != 0x7273000000000000) ||
                   (pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,2), pcVar6 == pcVar4))
                goto LAB_0010c44e;
                pcVar4 = flatcc_json_parser_union_vector
                                   (ctx,pcVar4,end,4,9,_more_1,Fantasy_Character_parse_json_union);
              }
            }
LAB_0010c456:
            buf = flatcc_json_parser_object_end(ctx,pcVar4,end,(int *)&val);
          }
          if (ctx->error != 0) goto LAB_0010be90;
          buf = flatcc_json_parser_finalize_unions(ctx,buf,end,_more_1);
          ref = flatcc_builder_end_table(ctx->ctx);
          if (ref == 0) goto LAB_0010be90;
        }
        else {
LAB_0010be90:
          buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
          if (ref == 0) goto LAB_0010a3d4;
        }
        pfVar11 = ctx->ctx;
        iVar2 = 1;
        goto LAB_0010c561;
      }
      pcVar4 = pcVar4 + 8;
      uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
      buf = pcVar4;
      if (((uVar5 & 0xffffffff00000000) != 0x7479706500000000) ||
         (buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,4), pcVar4 == buf))
      goto LAB_0010bec4;
      buf = flatcc_json_parser_union_type_vector
                      (ctx,buf,end,0,3,h_unions,
                       MyGame_Example_Alt_parse_json_table::symbolic_parsers,
                       MyGame_Example_Any_parse_json_union,MyGame_Example_Any_json_union_accept_type
                      );
      goto LAB_0010c57f;
    }
    if (uVar5 == 0x66697865645f6172) {
      pcVar4 = pcVar4 + 8;
      uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
      buf = pcVar4;
      if (((uint)(uVar5 >> 0x28) == 0x726179) &&
         (buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,3), pcVar4 != buf)) {
        struct_base = (float *)flatcc_builder_table_add(ctx->ctx,8,0x7c,4);
        if (struct_base != (float *)0x0) {
          buf = flatcc_json_parser_object_start(ctx,buf,end,&more_1);
          local_58 = struct_base + 0x1b;
          local_50 = struct_base + 0x1d;
          local_40 = struct_base + 0x10;
          local_48 = struct_base + 0x1a;
          local_70 = struct_base;
          while( true ) {
            if (more_1 == 0) break;
            pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
            uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
            pfVar14 = struct_base;
            if (0x666f6effffffffff < uVar5) {
              if (0x7465737472ffffff < uVar5) {
                if ((uVar5 & 0xffffffff00000000) == 0x7465787400000000) {
                  pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,4);
                  bVar15 = pcVar4 != pcVar6;
                  pcVar4 = pcVar6;
                  if (bVar15) {
                    pcVar6 = flatcc_json_parser_char_array(ctx,pcVar6,end,(char *)local_50,5);
                    goto LAB_0010a9b5;
                  }
                }
                else if (((uVar5 & 0xffffffffff000000) == 0x7465737473000000) &&
                        (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5),
                        bVar15 = pcVar4 != pcVar6, pcVar4 = pcVar6, bVar15)) {
                  pcVar6 = flatcc_json_parser_array_start(ctx,pcVar6,end,&more_1);
                  lVar13 = 2;
                  struct_base = local_58;
                  while (more_1 != 0) {
                    if (lVar13 == 0) {
                      if ((ctx->flags & 8) == 0) goto LAB_0010bef8;
                      lVar13 = 0;
                    }
                    else {
                      pcVar6 = MyGame_Example_Test_parse_json_struct_inline
                                         (ctx,pcVar6,end,struct_base);
                      lVar13 = lVar13 + -1;
                      struct_base = struct_base + 1;
                    }
                    pcVar6 = flatcc_json_parser_array_end(ctx,pcVar6,end,&more_1);
                  }
                  goto LAB_0010a978;
                }
                goto LAB_0010a96b;
              }
              if (((uVar5 & 0x7fffff0000000000) != 0x666f6f0000000000) ||
                 (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,3),
                 bVar15 = pcVar4 == pcVar6, pcVar4 = pcVar6, bVar15)) goto LAB_0010a96b;
              pcVar4 = flatcc_json_parser_array_start(ctx,pcVar6,end,&more_1);
              lVar13 = 0x10;
              while (pcVar6 = pcVar4, more_1 != 0) {
                _val = 0.0;
                pcVar6 = flatcc_json_parser_float(ctx,pcVar4,end,(float *)&val);
                if ((pcVar4 == pcVar6) &&
                   ((pcVar6 = flatcc_json_parser_symbolic_float
                                        (ctx,pcVar6,end,
                                         (flatcc_json_parser_integral_symbol_f **)
                                         MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers_48
                                         ,(float *)&val), pcVar6 == pcVar4 || (pcVar6 == end))))
                goto LAB_0010bed4;
                if (lVar13 == 0) {
                  if ((ctx->flags & 8) == 0) goto LAB_0010bef8;
                  lVar13 = 0;
                }
                else {
                  *struct_base = _val;
                  lVar13 = lVar13 + -1;
                  struct_base = struct_base + 1;
                }
                pcVar4 = flatcc_json_parser_array_end(ctx,pcVar6,end,&more_1);
              }
LAB_0010a978:
              pfVar14 = local_70;
              if (lVar13 == 0) goto LAB_0010a9b5;
              if ((ctx->flags & 0x10) == 0) {
                __n = lVar13 << 2;
                goto LAB_0010a99e;
              }
LAB_0010c5a5:
              iVar2 = 0x21;
              goto LAB_0010befd;
            }
            if ((uVar5 & 0x7fffff0000000000) == 0x6261720000000000) {
              pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,3);
              bVar15 = pcVar4 != pcVar6;
              pcVar4 = pcVar6;
              if (bVar15) {
                pcVar4 = flatcc_json_parser_array_start(ctx,pcVar6,end,&more_1);
                lVar13 = 10;
                struct_base = local_40;
                while (pcVar6 = pcVar4, more_1 != 0) {
                  _val = 0.0;
                  pcVar6 = flatcc_json_parser_int32(ctx,pcVar4,end,(int32_t *)&val);
                  if ((pcVar4 == pcVar6) &&
                     ((pcVar6 = flatcc_json_parser_symbolic_int32
                                          (ctx,pcVar6,end,
                                           (flatcc_json_parser_integral_symbol_f **)
                                           MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers_47
                                           ,(int32_t *)&val), pcVar6 == pcVar4 || (pcVar6 == end))))
                  goto LAB_0010bed4;
                  if (lVar13 == 0) {
                    if ((ctx->flags & 8) == 0) goto LAB_0010bef8;
                    lVar13 = 0;
                  }
                  else {
                    *struct_base = _val;
                    lVar13 = lVar13 + -1;
                    struct_base = struct_base + 1;
                  }
                  pcVar4 = flatcc_json_parser_array_end(ctx,pcVar6,end,&more_1);
                }
                goto LAB_0010a978;
              }
            }
            else if (((uVar5 & 0x7fffff0000000000) == 0x636f6c0000000000) &&
                    (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,3),
                    bVar15 = pcVar4 != pcVar6, pcVar4 = pcVar6, bVar15)) {
              pcVar4 = flatcc_json_parser_array_start(ctx,pcVar6,end,&more_1);
              __n = 3;
              struct_base = local_48;
              while (more_1 != 0) {
                _val = (float)((uint)_val & 0xffffff00);
                pcVar6 = flatcc_json_parser_int8(ctx,pcVar4,end,&val);
                if ((pcVar4 == pcVar6) &&
                   ((pcVar6 = flatcc_json_parser_symbolic_int8
                                        (ctx,pcVar6,end,
                                         (flatcc_json_parser_integral_symbol_f **)
                                         MyGame_Example_FooBar_parse_json_struct_inline_symbolic_parsers
                                         ,&val), pcVar6 == pcVar4 || (pcVar6 == end))))
                goto LAB_0010bed4;
                if (__n == 0) {
                  if ((ctx->flags & 8) == 0) goto LAB_0010bef8;
                  __n = 0;
                }
                else {
                  *(int8_t *)struct_base = val;
                  __n = __n - 1;
                  struct_base = (float *)((long)struct_base + 1);
                }
                pcVar4 = flatcc_json_parser_array_end(ctx,pcVar6,end,&more_1);
              }
              pfVar14 = local_70;
              pcVar6 = pcVar4;
              if (__n == 0) goto LAB_0010a9b5;
              if ((ctx->flags & 0x10) != 0) goto LAB_0010c5a5;
LAB_0010a99e:
              memset(struct_base,0,__n);
              pfVar14 = local_70;
              goto LAB_0010a9b5;
            }
LAB_0010a96b:
            pcVar6 = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
LAB_0010a9b5:
            buf = flatcc_json_parser_object_end(ctx,pcVar6,end,&more_1);
            struct_base = pfVar14;
          }
          goto LAB_0010c57f;
        }
        goto LAB_0010a3d4;
      }
    }
LAB_0010bec4:
    buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
  }
  else {
    if (uVar5 < 0x7072656669780000) {
      if ((uVar5 & 0x7fffffffff000000) == 0x6e616d6573000000) {
        buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5);
        if (pcVar4 == buf) goto LAB_0010bec4;
        iVar2 = flatcc_builder_start_offset_vector(ctx->ctx);
        if (iVar2 == 0) {
          buf = flatcc_json_parser_array_start(ctx,buf,end,&more);
          while (more != 0) {
            buf = flatcc_json_parser_build_string(ctx,buf,end,&ref);
            if ((ref == 0) ||
               (pfVar9 = flatcc_builder_extend_offset_vector(ctx->ctx,1),
               pfVar9 == (flatcc_builder_ref_t *)0x0)) goto LAB_0010a3d4;
            *pfVar9 = ref;
            buf = flatcc_json_parser_array_end(ctx,buf,end,&more);
          }
          ref = flatcc_builder_end_offset_vector(ctx->ctx);
          if (ref != 0) {
            pfVar11 = ctx->ctx;
            iVar2 = 6;
            goto LAB_0010c4b7;
          }
        }
        goto LAB_0010a3d4;
      }
      if (((uVar5 & 0x7fffffffffff0000) != 0x6d756c74696b0000) ||
         (buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,6), pcVar4 == buf)) {
        buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
        goto LAB_0010c57f;
      }
      iVar2 = flatcc_builder_start_offset_vector(ctx->ctx);
      if (iVar2 != 0) goto LAB_0010a3d4;
      buf = flatcc_json_parser_array_start(ctx,buf,end,&more);
      while (more != 0) {
        ref = 0;
        iVar2 = flatcc_builder_start_table(ctx->ctx,3);
        if (iVar2 == 0) {
          buf = flatcc_json_parser_object_start(ctx,buf,end,(int *)&val);
          while (_val != 0.0) {
            pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
            uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
            if (uVar5 < 0x68656c6c6f000000) {
              if ((uVar5 & 0x7fffffffffff0000) != 0x666f6f6261720000) goto LAB_0010bb7f;
              pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,6);
              if (pcVar4 == pcVar6) {
                buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar6,end);
              }
              else {
                _more_1 = 0;
                buf = flatcc_json_parser_int64(ctx,pcVar6,end,(int64_t *)&more_1);
                if ((pcVar6 == buf) &&
                   ((buf = flatcc_json_parser_symbolic_int64
                                     (ctx,buf,end,
                                      (flatcc_json_parser_integral_symbol_f **)
                                      MyGame_Example_MultipleKeys_parse_json_table_symbolic_parsers,
                                      (int64_t *)&more_1), buf == pcVar6 || (buf == end))))
                goto LAB_0010b961;
                uVar1 = _more_1;
                if ((_more_1 != 0) || ((ctx->flags & 2) != 0)) {
                  puVar8 = (ulong *)flatcc_builder_table_add(ctx->ctx,2,8,8);
                  if (puVar8 == (ulong *)0x0) goto LAB_0010b961;
                  *puVar8 = uVar1;
                }
              }
            }
            else {
              if ((uVar5 & 0xffffffffff000000) == 0x68656c6c6f000000) {
                pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5);
                bVar15 = pcVar4 != pcVar6;
                pcVar4 = pcVar6;
                if (bVar15) {
                  buf = flatcc_json_parser_build_string(ctx,pcVar6,end,&ref_1);
                  if (ref_1 != 0) {
                    pfVar11 = ctx->ctx;
                    iVar2 = 0;
                    goto LAB_0010bb63;
                  }
                  goto LAB_0010b961;
                }
              }
              else if (((uVar5 & 0xffffffffff000000) == 0x776f726c64000000) &&
                      (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5),
                      bVar15 = pcVar4 != pcVar6, pcVar4 = pcVar6, bVar15)) {
                buf = flatcc_json_parser_build_string(ctx,pcVar6,end,&ref_1);
                if (ref_1 != 0) {
                  pfVar11 = ctx->ctx;
                  iVar2 = 1;
LAB_0010bb63:
                  pfVar9 = flatcc_builder_table_add_offset(pfVar11,iVar2);
                  if (pfVar9 != (flatcc_builder_ref_t *)0x0) {
                    *pfVar9 = ref_1;
                    goto LAB_0010bba2;
                  }
                }
                goto LAB_0010b961;
              }
LAB_0010bb7f:
              buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
            }
LAB_0010bba2:
            buf = flatcc_json_parser_object_end(ctx,buf,end,(int *)&val);
          }
          if ((ctx->error != 0) || (ref = flatcc_builder_end_table(ctx->ctx), ref == 0))
          goto LAB_0010b961;
        }
        else {
LAB_0010b961:
          buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
          if (ref == 0) goto LAB_0010a3d4;
        }
        pfVar9 = flatcc_builder_extend_offset_vector(ctx->ctx,1);
        if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010a3d4;
        *pfVar9 = ref;
        buf = flatcc_json_parser_array_end(ctx,buf,end,&more);
      }
      ref = flatcc_builder_end_offset_vector(ctx->ctx);
      if (ref == 0) goto LAB_0010a3d4;
      pfVar11 = ctx->ctx;
      iVar2 = 4;
    }
    else {
      if (0x726170756e7a656b < uVar5) {
        if (uVar5 == 0x726170756e7a656c) {
          pcVar4 = pcVar4 + 8;
          uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
          buf = pcVar4;
          if (((char)(uVar5 >> 0x38) != 's') ||
             (buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,1), pcVar4 == buf))
          goto LAB_0010bec4;
          iVar2 = flatcc_builder_start_vector(ctx->ctx,8,4,0x1fffffff);
          if (iVar2 == 0) {
            buf = flatcc_json_parser_array_start(ctx,buf,end,&more);
            while (more != 0) {
              struct_base_00 = flatcc_builder_extend_vector(ctx->ctx,1);
              if (struct_base_00 == (void *)0x0) goto LAB_0010a3d4;
              pcVar4 = Fantasy_Rapunzel_parse_json_struct_inline(ctx,buf,end,struct_base_00);
              buf = flatcc_json_parser_array_end(ctx,pcVar4,end,&more);
            }
            ref = flatcc_builder_end_vector(ctx->ctx);
            if (ref != 0) {
              pfVar11 = ctx->ctx;
              iVar2 = 5;
LAB_0010c4b7:
              pfVar9 = flatcc_builder_table_add_offset(pfVar11,iVar2);
              if (pfVar9 != (flatcc_builder_ref_t *)0x0) {
                *pfVar9 = ref;
                goto LAB_0010c57f;
              }
            }
          }
          goto LAB_0010a3d4;
        }
        if ((uVar5 >> 8 == 0x73616d706c6573) &&
           (buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,7), pcVar4 != buf)) {
          iVar2 = flatcc_builder_start_vector(ctx->ctx,4,4,0x3fffffff);
          if (iVar2 == 0) {
            buf = flatcc_json_parser_array_start(ctx,buf,end,&more);
            while (more != 0) {
              _more_1 = _more_1 & 0xffffffff00000000;
              piVar7 = (int *)flatcc_builder_extend_vector(ctx->ctx,1);
              if ((piVar7 == (int *)0x0) ||
                 ((pcVar4 = flatcc_json_parser_float(ctx,buf,end,(float *)&more_1), buf == pcVar4 &&
                  ((pcVar4 = flatcc_json_parser_symbolic_float
                                       (ctx,pcVar4,end,
                                        MyGame_Example_Alt_parse_json_table::symbolic_parsers_1,
                                        (float *)&more_1), bVar15 = pcVar4 == buf, buf = pcVar4,
                   bVar15 || (pcVar4 == end)))))) goto LAB_0010a3d4;
              *piVar7 = more_1;
              buf = flatcc_json_parser_array_end(ctx,pcVar4,end,&more);
            }
            ref = flatcc_builder_end_vector(ctx->ctx);
            if (ref != 0) {
              pfVar11 = ctx->ctx;
              iVar2 = 7;
              goto LAB_0010c4b7;
            }
          }
          goto LAB_0010a3d4;
        }
        goto LAB_0010bec4;
      }
      if (((uVar5 & 0x7fffffffffff0000) != 0x7072656669780000) ||
         (buf = flatcc_json_parser_match_symbol(ctx,pcVar4,end,6), pcVar4 == buf))
      goto LAB_0010bec4;
      ref = 0;
      iVar2 = flatcc_builder_start_table(ctx->ctx,3);
      if (iVar2 == 0) {
        buf = flatcc_json_parser_object_start(ctx,buf,end,&local_64);
        while (local_64 != 0) {
          pcVar6 = flatcc_json_parser_symbol_start(ctx,buf,end);
          uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
          pcVar4 = pcVar6;
          if (uVar5 == 0x746573746a736f6e) {
            pcVar4 = pcVar6 + 8;
            uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
            if (uVar5 != 0x7072656669787061) goto LAB_0010b85e;
            pcVar6 = pcVar6 + 0x10;
            uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
            if ((uVar5 & 0xffffffffffff0000) == 0x7273696e67320000) {
              pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,6);
              if (pcVar6 != pcVar4) {
                iVar2 = flatcc_builder_start_table(ctx->ctx,2);
                buf = pcVar4;
                if (iVar2 == 0) {
                  buf = flatcc_json_parser_object_start(ctx,pcVar4,end,(int *)&val);
                  while (_val != 0.0) {
                    pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
                    uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
                    if (uVar5 == 0x616161615f626262) {
                      pcVar4 = pcVar4 + 8;
                      uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
                      if ((uVar5 & 0xffffffffffffff00) == 0x625f737465707300) {
                        pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,7);
                        if (pcVar4 == pcVar6) {
LAB_0010adf4:
                          buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar6,end);
                        }
                        else {
                          _more_1 = 0;
                          buf = flatcc_json_parser_int64(ctx,pcVar6,end,(int64_t *)&more_1);
                          if ((pcVar6 == buf) &&
                             ((buf = flatcc_json_parser_symbolic_int64
                                               (ctx,buf,end,
                                                (flatcc_json_parser_integral_symbol_f **)
                                                MyGame_Example_TestJSONPrefixParsing2_parse_json_table_symbolic_parsers
                                                ,(int64_t *)&more_1), buf == pcVar6 || (buf == end))
                             )) goto LAB_0010c529;
                          uVar1 = _more_1;
                          if ((_more_1 != 0) || ((ctx->flags & 2) != 0)) {
                            puVar8 = (ulong *)flatcc_builder_table_add(ctx->ctx,0,8,8);
                            if (puVar8 == (ulong *)0x0) goto LAB_0010c529;
                            *puVar8 = uVar1;
                          }
                        }
                      }
                      else {
                        if (uVar5 != 0x625f73746172745f) goto LAB_0010adde;
                        pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,8);
                        if (pcVar4 == pcVar6) goto LAB_0010adf4;
                        _more_1 = _more_1 & 0xffffffff00000000;
                        buf = flatcc_json_parser_uint32(ctx,pcVar6,end,(uint32_t *)&more_1);
                        if ((pcVar6 == buf) &&
                           ((buf = flatcc_json_parser_symbolic_uint32
                                             (ctx,buf,end,
                                              (flatcc_json_parser_integral_symbol_f **)
                                              MyGame_Example_TestJSONPrefixParsing2_parse_json_table_symbolic_parsers_53
                                              ,(uint32_t *)&more_1), buf == pcVar6 || (buf == end)))
                           ) goto LAB_0010c529;
                        iVar2 = more_1;
                        if ((more_1 != 0) || ((ctx->flags & 2) != 0)) {
                          piVar7 = (int *)flatcc_builder_table_add(ctx->ctx,1,4,4);
                          if (piVar7 == (int *)0x0) goto LAB_0010c529;
                          *piVar7 = iVar2;
                        }
                      }
                    }
                    else {
LAB_0010adde:
                      buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
                    }
                    buf = flatcc_json_parser_object_end(ctx,buf,end,(int *)&val);
                  }
                  if ((ctx->error == 0) && (fVar3 = flatcc_builder_end_table(ctx->ctx), fVar3 != 0))
                  {
                    pfVar11 = ctx->ctx;
                    iVar2 = 1;
                    goto LAB_0010b8ca;
                  }
                }
                goto LAB_0010c529;
              }
              goto LAB_0010b85e;
            }
            buf = pcVar6;
            if (((uVar5 & 0xffffffffff000000) != 0x7273696e67000000) ||
               (buf = flatcc_json_parser_match_symbol(ctx,pcVar6,end,5), pcVar6 == buf)) {
              pcVar4 = buf;
              if ((uVar5 & 0xffffffffffff0000) == 0x7273696e67330000) {
                pcVar4 = flatcc_json_parser_match_symbol(ctx,buf,end,6);
                if (buf != pcVar4) {
                  iVar2 = flatcc_builder_start_table(ctx->ctx,2);
                  buf = pcVar4;
                  if (iVar2 == 0) {
                    buf = flatcc_json_parser_object_start(ctx,pcVar4,end,(int *)&val);
                    while (_val != 0.0) {
                      pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
                      uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
                      if (uVar5 == 0x616161615f626262) {
                        pcVar6 = pcVar4 + 8;
                        uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                        if (uVar5 == 0x625f73746172745f) {
                          pcVar4 = pcVar4 + 0x10;
                          uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
                          if (uVar5 >> 0x18 != 0x7374657073) goto LAB_0010b6e8;
                          buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,5);
                          if (pcVar4 == buf_00) {
LAB_0010b7c4:
                            buf = flatcc_json_parser_unmatched_symbol(ctx,buf_00,end);
                          }
                          else {
                            _more_1 = _more_1 & 0xffffffff00000000;
                            buf = flatcc_json_parser_uint32(ctx,buf_00,end,(uint32_t *)&more_1);
                            if ((buf_00 == buf) &&
                               ((buf = flatcc_json_parser_symbolic_uint32
                                                 (ctx,buf,end,
                                                  (flatcc_json_parser_integral_symbol_f **)
                                                  MyGame_Example_TestJSONPrefixParsing3_parse_json_table_symbolic_parsers
                                                  ,(uint32_t *)&more_1), buf == buf_00 ||
                                (buf == end)))) goto LAB_0010c529;
                            iVar2 = more_1;
                            if ((more_1 != 0) || ((ctx->flags & 2) != 0)) {
                              piVar7 = (int *)flatcc_builder_table_add(ctx->ctx,1,4,4);
                              if (piVar7 == (int *)0x0) goto LAB_0010c529;
                              *piVar7 = iVar2;
                            }
                          }
                        }
                        else {
                          pcVar4 = pcVar6;
                          if ((uVar5 & 0xffffffffffffff00) != 0x625f737465707300) goto LAB_0010b6e8;
                          buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,7);
                          if (pcVar6 == buf_00) goto LAB_0010b7c4;
                          _more_1 = 0;
                          buf = flatcc_json_parser_int64(ctx,buf_00,end,(int64_t *)&more_1);
                          if ((buf_00 == buf) &&
                             ((buf = flatcc_json_parser_symbolic_int64
                                               (ctx,buf,end,
                                                (flatcc_json_parser_integral_symbol_f **)
                                                MyGame_Example_TestJSONPrefixParsing3_parse_json_table_symbolic_parsers_59
                                                ,(int64_t *)&more_1), buf == buf_00 || (buf == end))
                             )) goto LAB_0010c529;
                          uVar1 = _more_1;
                          if ((_more_1 != 0) || ((ctx->flags & 2) != 0)) {
                            puVar8 = (ulong *)flatcc_builder_table_add(ctx->ctx,0,8,8);
                            if (puVar8 == (ulong *)0x0) goto LAB_0010c529;
                            *puVar8 = uVar1;
                          }
                        }
                      }
                      else {
LAB_0010b6e8:
                        buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
                      }
                      buf = flatcc_json_parser_object_end(ctx,buf,end,(int *)&val);
                    }
                    if ((ctx->error == 0) &&
                       (fVar3 = flatcc_builder_end_table(ctx->ctx), fVar3 != 0)) {
                      pfVar11 = ctx->ctx;
                      iVar2 = 2;
                      goto LAB_0010b8ca;
                    }
                  }
                  goto LAB_0010c529;
                }
              }
              goto LAB_0010b85e;
            }
            iVar2 = flatcc_builder_start_table(ctx->ctx,9);
            if (iVar2 != 0) {
LAB_0010c529:
              buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
              goto LAB_0010c53d;
            }
            buf = flatcc_json_parser_object_start(ctx,buf,end,(int *)&val);
            while (_val != 0.0) {
              pcVar4 = flatcc_json_parser_symbol_start(ctx,buf,end);
              uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
              if (uVar5 < 0x6363636300000000) {
                if (uVar5 == 0x6161616131323334) {
                  pcVar4 = pcVar4 + 8;
                  uVar5 = flatcc_json_parser_symbol_part(pcVar4,end);
                  pcVar6 = pcVar4;
                  if (((uVar5 & 0xff00000000000000) == 0x3500000000000000) &&
                     (pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,1), pcVar4 != pcVar6))
                  {
                    _more_1 = _more_1 & 0xffffffff00000000;
                    buf = flatcc_json_parser_uint32(ctx,pcVar6,end,(uint32_t *)&more_1);
                    if ((pcVar6 == buf) &&
                       ((buf = flatcc_json_parser_symbolic_uint32
                                         (ctx,buf,end,
                                          (flatcc_json_parser_integral_symbol_f **)
                                          MyGame_Example_TestJSONPrefixParsing_parse_json_table_symbolic_parsers
                                          ,(uint32_t *)&more_1), buf == pcVar6 || (buf == end))))
                    goto LAB_0010c529;
                    if ((more_1 != 0) || ((ctx->flags & 2) != 0)) {
                      pfVar11 = ctx->ctx;
                      id = 1;
                      iVar2 = more_1;
LAB_0010b517:
                      piVar7 = (int *)flatcc_builder_table_add(pfVar11,id,4,4);
                      if (piVar7 == (int *)0x0) goto LAB_0010c529;
                      *piVar7 = iVar2;
                    }
                  }
                  else {
LAB_0010b4a8:
                    buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar6,end);
                  }
                }
                else {
                  if ((uVar5 & 0x7fffffff00000000) == 0x6161616100000000) {
                    pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,4);
                    if (pcVar4 != pcVar6) {
                      buf = flatcc_json_parser_build_string(ctx,pcVar6,end,&ref_1);
                      if ((ref_1 != 0) &&
                         (pfVar9 = flatcc_builder_table_add_offset(ctx->ctx,0),
                         pfVar9 != (flatcc_builder_ref_t *)0x0)) {
                        *pfVar9 = ref_1;
                        goto LAB_0010b4b8;
                      }
                      goto LAB_0010c529;
                    }
                    pcVar4 = pcVar6;
                    if (uVar5 == 0x6262626231323334) goto LAB_0010b2f1;
                  }
                  else if (uVar5 == 0x6262626231323334) {
LAB_0010b2f1:
                    pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,8);
                    bVar15 = pcVar4 != pcVar6;
                    pcVar4 = pcVar6;
                    if (bVar15) {
                      _more_1 = 0;
                      buf = flatcc_json_parser_int64(ctx,pcVar6,end,(int64_t *)&more_1);
                      if ((pcVar6 != buf) ||
                         ((buf = flatcc_json_parser_symbolic_int64
                                           (ctx,buf,end,
                                            (flatcc_json_parser_integral_symbol_f **)
                                            MyGame_Example_TestJSONPrefixParsing_parse_json_table_symbolic_parsers_54
                                            ,(int64_t *)&more_1), buf != pcVar6 && (buf != end)))) {
                        if ((_more_1 != 0) || ((ctx->flags & 2) != 0)) {
                          pfVar11 = ctx->ctx;
                          iVar2 = 3;
                          goto LAB_0010b379;
                        }
                        goto LAB_0010b4b8;
                      }
                      goto LAB_0010c529;
                    }
                  }
                  else if ((uVar5 & 0x7fffffff00000000) == 0x6262626200000000) {
                    pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,4);
                    if (pcVar4 == pcVar6) goto LAB_0010b3a4;
                    buf = flatcc_json_parser_build_string(ctx,pcVar6,end,&ref_1);
                    if (ref_1 != 0) {
                      pfVar11 = ctx->ctx;
                      iVar2 = 2;
                      goto LAB_0010b12f;
                    }
                    goto LAB_0010c529;
                  }
LAB_0010b3c5:
                  buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
                }
              }
              else if (uVar5 == 0x6363636331323334) {
                pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,8);
                if (pcVar4 == pcVar6) {
                  pcVar6 = pcVar6 + 8;
                  uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                  if ((uVar5 & 0xff00000000000000) != 0x3500000000000000) goto LAB_0010b4a8;
                  pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,1);
                  if (pcVar6 == pcVar4) goto LAB_0010b3c5;
                  _more_1 = _more_1 & 0xffffffff00000000;
                  buf = flatcc_json_parser_uint32(ctx,pcVar4,end,(uint32_t *)&more_1);
                  if ((pcVar4 == buf) &&
                     ((buf = flatcc_json_parser_symbolic_uint32
                                       (ctx,buf,end,
                                        (flatcc_json_parser_integral_symbol_f **)
                                        MyGame_Example_TestJSONPrefixParsing_parse_json_table_symbolic_parsers_56
                                        ,(uint32_t *)&more_1), buf == pcVar4 || (buf == end))))
                  goto LAB_0010c529;
                  if ((more_1 != 0) || ((ctx->flags & 2) != 0)) {
                    pfVar11 = ctx->ctx;
                    id = 6;
                    iVar2 = more_1;
                    goto LAB_0010b517;
                  }
                }
                else {
                  _more_1 = 0;
                  buf = flatcc_json_parser_int64(ctx,pcVar6,end,(int64_t *)&more_1);
                  if ((pcVar6 == buf) &&
                     ((buf = flatcc_json_parser_symbolic_int64
                                       (ctx,buf,end,
                                        (flatcc_json_parser_integral_symbol_f **)
                                        MyGame_Example_TestJSONPrefixParsing_parse_json_table_symbolic_parsers_55
                                        ,(int64_t *)&more_1), buf == pcVar6 || (buf == end))))
                  goto LAB_0010c529;
                  if ((_more_1 != 0) || ((ctx->flags & 2) != 0)) {
                    pfVar11 = ctx->ctx;
                    iVar2 = 5;
LAB_0010b379:
                    uVar1 = _more_1;
                    puVar8 = (ulong *)flatcc_builder_table_add(pfVar11,iVar2,8,8);
                    if (puVar8 == (ulong *)0x0) goto LAB_0010c529;
                    *puVar8 = uVar1;
                  }
                }
              }
              else if ((uVar5 & 0xffffffff00000000) == 0x6363636300000000) {
                pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,4);
                if (pcVar4 == pcVar6) {
LAB_0010b3a4:
                  buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar6,end);
                }
                else {
                  buf = flatcc_json_parser_build_string(ctx,pcVar6,end,&ref_1);
                  if (ref_1 == 0) goto LAB_0010c529;
                  pfVar11 = ctx->ctx;
                  iVar2 = 4;
LAB_0010b12f:
                  pfVar9 = flatcc_builder_table_add_offset(pfVar11,iVar2);
                  if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c529;
                  *pfVar9 = ref_1;
                }
              }
              else {
                pcVar6 = pcVar4;
                if (uVar5 != 0x6464646431323334) goto LAB_0010b3a4;
                pcVar6 = flatcc_json_parser_match_symbol(ctx,pcVar4,end,8);
                if (pcVar4 == pcVar6) {
                  pcVar6 = pcVar6 + 8;
                  uVar5 = flatcc_json_parser_symbol_part(pcVar6,end);
                  if ((uVar5 & 0xff00000000000000) != 0x3500000000000000) goto LAB_0010b4a8;
                  pcVar4 = flatcc_json_parser_match_symbol(ctx,pcVar6,end,1);
                  if (pcVar6 == pcVar4) goto LAB_0010b3c5;
                  _more_1 = _more_1 & 0xffffffff00000000;
                  buf = flatcc_json_parser_uint32(ctx,pcVar4,end,(uint32_t *)&more_1);
                  if ((pcVar4 == buf) &&
                     ((buf = flatcc_json_parser_symbolic_uint32
                                       (ctx,buf,end,
                                        (flatcc_json_parser_integral_symbol_f **)
                                        MyGame_Example_TestJSONPrefixParsing_parse_json_table_symbolic_parsers_58
                                        ,(uint32_t *)&more_1), buf == pcVar4 || (buf == end))))
                  goto LAB_0010c529;
                  if ((more_1 != 0) || ((ctx->flags & 2) != 0)) {
                    pfVar11 = ctx->ctx;
                    id = 8;
                    iVar2 = more_1;
                    goto LAB_0010b517;
                  }
                }
                else {
                  _more_1 = 0;
                  buf = flatcc_json_parser_int64(ctx,pcVar6,end,(int64_t *)&more_1);
                  if ((pcVar6 == buf) &&
                     ((buf = flatcc_json_parser_symbolic_int64
                                       (ctx,buf,end,
                                        (flatcc_json_parser_integral_symbol_f **)
                                        MyGame_Example_TestJSONPrefixParsing_parse_json_table_symbolic_parsers_57
                                        ,(int64_t *)&more_1), buf == pcVar6 || (buf == end))))
                  goto LAB_0010c529;
                  if ((_more_1 != 0) || ((ctx->flags & 2) != 0)) {
                    pfVar11 = ctx->ctx;
                    iVar2 = 7;
                    goto LAB_0010b379;
                  }
                }
              }
LAB_0010b4b8:
              buf = flatcc_json_parser_object_end(ctx,buf,end,(int *)&val);
            }
            if ((ctx->error != 0) || (fVar3 = flatcc_builder_end_table(ctx->ctx), fVar3 == 0))
            goto LAB_0010c529;
            pfVar11 = ctx->ctx;
            iVar2 = 0;
LAB_0010b8ca:
            pfVar9 = flatcc_builder_table_add_offset(pfVar11,iVar2);
            if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c53d;
            *pfVar9 = fVar3;
          }
          else {
LAB_0010b85e:
            buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar4,end);
          }
          buf = flatcc_json_parser_object_end(ctx,buf,end,&local_64);
        }
        if ((ctx->error != 0) || (ref = flatcc_builder_end_table(ctx->ctx), ref == 0))
        goto LAB_0010c53d;
      }
      else {
LAB_0010c53d:
        buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
        if (ref == 0) goto LAB_0010a3d4;
      }
      pfVar11 = ctx->ctx;
      iVar2 = 0;
    }
LAB_0010c561:
    pfVar9 = flatcc_builder_table_add_offset(pfVar11,iVar2);
    if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010a3d4;
    *pfVar9 = ref;
  }
  goto LAB_0010c57f;
LAB_0010bed4:
  buf = flatcc_json_parser_set_error(ctx,pcVar6,end,0x23);
  goto LAB_0010c57f;
LAB_0010bef8:
  iVar2 = 0x22;
LAB_0010befd:
  buf = flatcc_json_parser_set_error(ctx,pcVar6,end,iVar2);
LAB_0010c57f:
  buf = flatcc_json_parser_object_end(ctx,buf,end,&more);
  goto LAB_0010a43f;
LAB_0010c5bc:
  if (ctx->error == 0) {
    buf = flatcc_json_parser_finalize_unions(ctx,buf,end,h_unions);
    fVar3 = flatcc_builder_end_table(ctx->ctx);
    *local_38 = fVar3;
    if (fVar3 != 0) {
      return buf;
    }
  }
LAB_0010a3d4:
  pcVar4 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar4;
}

Assistant:

static const char *MyGame_Example_Alt_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 9)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 1, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6d756c74696b0000) { /* branch "multik" */
            if (w < 0x6d616e79616e7900) { /* branch "manyany" */
                if (w == 0x66697865645f6172) { /* descend "fixed_ar" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffff0000000000) == 0x7261790000000000) { /* "ray" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                        if (mark != buf) {
                            if (!(pval = flatcc_builder_table_add(ctx->ctx, 8, 124, 4))) goto failed;
                            buf = MyGame_Example_FooBar_parse_json_struct_inline(ctx, buf, end, pval);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "ray" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "ray" */
                } else { /* descend "fixed_ar" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "fixed_ar" */
            } else { /* branch "manyany" */
                if (w == 0x6d616e79616e795f) { /* descend "manyany_" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x7479706500000000) { /* "type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    MyGame_Example_Any_parse_json_enum,
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 0, 3, h_unions, symbolic_parsers, MyGame_Example_Any_parse_json_union, MyGame_Example_Any_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "type" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "type" */
                } else { /* descend "manyany_" */
                    if ((w & 0xffffffffffffff00) == 0x6d616e79616e7900) { /* "manyany" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union_vector(ctx, buf, end, 0, 3, h_unions, MyGame_Example_Any_parse_json_union);
                        } else {
                            goto pfguard1;
                        }
                    } else { /* "manyany" */
                        goto pfguard1;
                    } /* "manyany" */
                    goto endpfguard1;
pfguard1:
                    if ((w & 0xffffffffff000000) == 0x6d6f766965000000) { /* "movie" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = Fantasy_Movie_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "movie" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "movie" */
endpfguard1:
                    (void)0;
                } /* descend "manyany_" */
            } /* branch "manyany" */
        } else { /* branch "multik" */
            if (w < 0x7072656669780000) { /* branch "prefix" */
                if ((w & 0xffffffffff000000) == 0x6e616d6573000000) { /* "names" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                        buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                        while (more) {
                            buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                            buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                        }
                        ref = flatcc_builder_end_offset_vector(ctx->ctx);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 6))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "names" */
                    if ((w & 0xffffffffffff0000) == 0x6d756c74696b0000) { /* "multik" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                            buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                            while (more) {
                                buf = MyGame_Example_MultipleKeys_parse_json_table(ctx, buf, end, &ref);
                                if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                                *pref = ref;
                                buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                            }
                            ref = flatcc_builder_end_offset_vector(ctx->ctx);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 4))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "multik" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "multik" */
                } /* "names" */
            } else { /* branch "prefix" */
                if (w < 0x726170756e7a656c) { /* branch "rapunzel" */
                    if ((w & 0xffffffffffff0000) == 0x7072656669780000) { /* "prefix" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            buf = MyGame_Example_TestJSONPrefix_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "prefix" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "prefix" */
                } else { /* branch "rapunzel" */
                    if (w == 0x726170756e7a656c) { /* descend "rapunzel" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xff00000000000000) == 0x7300000000000000) { /* "s" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 8, 4, UINT64_C(536870911))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx, buf, end, pval);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 5))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "s" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "s" */
                    } else { /* descend "rapunzel" */
                        if ((w & 0xffffffffffffff00) == 0x73616d706c657300) { /* "samples" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 4, 4, UINT64_C(1073741823))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    float val = 0;
                                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                            monster_test_local_MyGame_Example_json_parser_enum,
                                            monster_test_global_json_parser_enum, 0 };
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                    if (mark == buf) {
                                        buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                        if (buf == mark || buf == end) goto failed;
                                    }
                                    flatbuffers_float_write_to_pe(pval, val);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 7))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "samples" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "samples" */
                    } /* descend "rapunzel" */
                } /* branch "rapunzel" */
            } /* branch "prefix" */
        } /* branch "multik" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}